

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::SetScissorRects
          (DeviceContextGLImpl *this,Uint32 NumRects,Rect *pRects,Uint32 RTWidth,Uint32 RTHeight)

{
  Char *pCVar1;
  Rect *pRVar2;
  undefined1 local_d0 [8];
  string msg_2;
  GLenum err_1;
  int height_1;
  int width_1;
  int glBottom_1;
  Rect *Rect_1;
  undefined1 local_90 [4];
  Uint32 sr;
  string msg_1;
  GLenum err;
  int height;
  int width;
  int glBottom;
  Rect *Rect;
  undefined1 local_48 [8];
  string msg;
  Uint32 RTHeight_local;
  Uint32 RTWidth_local;
  Rect *pRects_local;
  Uint32 NumRects_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_4_ = RTHeight;
  msg.field_2._12_4_ = RTWidth;
  DeviceContextBase<Diligent::EngineGLImplTraits>::SetScissorRects
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,NumRects,pRects,
             (Uint32 *)(msg.field_2._M_local_buf + 0xc),(Uint32 *)(msg.field_2._M_local_buf + 8));
  if (NumRects != (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumScissorRects) {
    FormatString<char[35]>((string *)local_48,(char (*) [35])"Unexpected number of scissor rects");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x140);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (NumRects == 1) {
    pRVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects;
    msg_1.field_2._12_4_ =
         (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].bottom -
         (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].top;
    glScissor(pRVar2->left,
              msg.field_2._8_4_ -
              (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].bottom
              ,(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].right
               - pRVar2->left,msg_1.field_2._12_4_);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x156,(char (*) [27])"Failed to set scissor rect",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_90,(char (*) [6])0xe8e72e);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x156);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  else {
    for (Rect_1._4_4_ = 0; Rect_1._4_4_ < NumRects; Rect_1._4_4_ = Rect_1._4_4_ + 1) {
      pRVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects +
               Rect_1._4_4_;
      msg_2.field_2._12_4_ = pRVar2->bottom - pRVar2->top;
      (*__glewScissorIndexed)
                (Rect_1._4_4_,pRVar2->left,msg.field_2._8_4_ - pRVar2->bottom,
                 pRVar2->right - pRVar2->left,msg_2.field_2._12_4_);
      msg_2.field_2._8_4_ = glGetError();
      if (msg_2.field_2._8_4_ != 0) {
        LogError<false,char[29],unsigned_int,char[17],unsigned_int>
                  (false,"SetScissorRects",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x162,(char (*) [29])"Failed to set scissor rect #",(uint *)((long)&Rect_1 + 4),
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_d0,(char (*) [6])0xe8e72e);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetScissorRects",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x162);
        std::__cxx11::string::~string((string *)local_d0);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::SetScissorRects(Uint32 NumRects, const Rect* pRects, Uint32 RTWidth, Uint32 RTHeight)
{
    TDeviceContextBase::SetScissorRects(NumRects, pRects, RTWidth, RTHeight);

    VERIFY(NumRects == m_NumScissorRects, "Unexpected number of scissor rects");
    if (NumRects == 1)
    {
        const Rect& Rect = m_ScissorRects[0];
        // Note that OpenGL and DirectX use different origin
        // of the viewport in window coordinates:
        //
        // DirectX (0,0)
        //     \ ____________
        //      |            |
        //      |            |
        //      |            |
        //      |            |
        //      |____________|
        //     /
        //  OpenGL (0,0)
        //
        int glBottom = RTHeight - Rect.bottom;

        int width  = Rect.right - Rect.left;
        int height = Rect.bottom - Rect.top;
        glScissor(Rect.left, glBottom, width, height);
        DEV_CHECK_GL_ERROR("Failed to set scissor rect");
    }
    else
    {
        for (Uint32 sr = 0; sr < NumRects; ++sr)
        {
            const Rect& Rect = m_ScissorRects[sr];

            int glBottom = RTHeight - Rect.bottom;
            int width    = Rect.right - Rect.left;
            int height   = Rect.bottom - Rect.top;
            glScissorIndexed(sr, Rect.left, glBottom, width, height);
            DEV_CHECK_GL_ERROR("Failed to set scissor rect #", sr);
        }
    }
}